

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O2

void __thiscall cmCPackRPMGenerator::AddGeneratedPackageNames(cmCPackRPMGenerator *this)

{
  char *pcVar1;
  long lVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char cVar3;
  allocator local_72;
  allocator local_71;
  string local_70;
  string fileNames;
  
  std::__cxx11::string::string((string *)&local_70,"GEN_CPACK_OUTPUT_FILES",&local_71);
  pcVar1 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_70);
  std::__cxx11::string::string((string *)&fileNames,pcVar1,&local_72);
  std::__cxx11::string::~string((string *)&local_70);
  cVar3 = (char)&fileNames;
  lVar2 = std::__cxx11::string::find(cVar3,0x3b);
  this_00 = &(this->super_cmCPackGenerator).packageFileNames;
  while (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)&fileNames);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_70);
    std::__cxx11::string::~string((string *)&local_70);
    lVar2 = std::__cxx11::string::find(cVar3,0x3b);
  }
  std::__cxx11::string::substr((ulong)&local_70,(ulong)&fileNames);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&local_70)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&fileNames);
  return;
}

Assistant:

void cmCPackRPMGenerator::AddGeneratedPackageNames()
{
  // add the generated packages to package file names list
  std::string fileNames(this->GetOption("GEN_CPACK_OUTPUT_FILES"));
  const char sep = ';';
  std::string::size_type pos1 = 0;
  std::string::size_type pos2 = fileNames.find(sep, pos1 + 1);
  while (pos2 != std::string::npos) {
    packageFileNames.push_back(fileNames.substr(pos1, pos2 - pos1));
    pos1 = pos2 + 1;
    pos2 = fileNames.find(sep, pos1 + 1);
  }
  packageFileNames.push_back(fileNames.substr(pos1, pos2 - pos1));
}